

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_racedump(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  FILE *pFVar6;
  const_reference pvVar7;
  __type_conflict2 _Var8;
  char buf [4608];
  long temp_bit;
  int i;
  int race;
  FILE *fp;
  long in_stack_ffffffffffffed78;
  FILE *in_stack_ffffffffffffed80;
  undefined4 in_stack_ffffffffffffed88;
  uint in_stack_ffffffffffffed8c;
  char *in_stack_ffffffffffffed90;
  char local_1228 [4608];
  ulong local_28;
  uint local_20;
  uint local_1c;
  FILE *local_18;
  
  local_18 = fopen("../logs/racdump.txt","w");
  local_20 = 0;
  local_28 = 0;
  local_1c = 0;
  while( true ) {
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    pFVar6 = local_18;
    if (pvVar7->name == (char *)0x0) break;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    pcVar1 = pvVar7->name;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    pcVar2 = pvVar7->name;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    pcVar3 = pvVar7->name;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    fprintf(pFVar6,";%s;%s;%s;%s;",pcVar1,pcVar2,pcVar3,pvVar7->name);
    pFVar6 = local_18;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    fprintf(pFVar6," %d;",(ulong)(pvVar7->pc_race & 1));
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 10; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->act[(int)local_20] != -99) {
        std::vector<race_type,_std::allocator<race_type>_>::operator[]
                  (&race_table,(long)(int)local_1c);
        _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   in_stack_ffffffffffffed78);
        local_28 = (long)_Var8 | local_28;
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 10; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->aff[(int)local_20] != -99) {
        std::vector<race_type,_std::allocator<race_type>_>::operator[]
                  (&race_table,(long)(int)local_1c);
        _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   in_stack_ffffffffffffed78);
        local_28 = (long)_Var8 | local_28;
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 10; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->off[(int)local_20] != -99) {
        std::vector<race_type,_std::allocator<race_type>_>::operator[]
                  (&race_table,(long)(int)local_1c);
        _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   in_stack_ffffffffffffed78);
        local_28 = (long)_Var8 | local_28;
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 10; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->imm[(int)local_20] != -99) {
        std::vector<race_type,_std::allocator<race_type>_>::operator[]
                  (&race_table,(long)(int)local_1c);
        _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   in_stack_ffffffffffffed78);
        local_28 = (long)_Var8 | local_28;
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 10; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->res[(int)local_20] != -99) {
        std::vector<race_type,_std::allocator<race_type>_>::operator[]
                  (&race_table,(long)(int)local_1c);
        _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   in_stack_ffffffffffffed78);
        local_28 = (long)_Var8 | local_28;
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 10; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->vuln[(int)local_20] != -99) {
        std::vector<race_type,_std::allocator<race_type>_>::operator[]
                  (&race_table,(long)(int)local_1c);
        _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                   in_stack_ffffffffffffed78);
        local_28 = (long)_Var8 | local_28;
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 0xf; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->form[(int)local_20] != -99) {
        pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                           (&race_table,(long)(int)local_1c);
        if (pvVar7->form[(int)local_20] < 0x1c) {
          std::vector<race_type,_std::allocator<race_type>_>::operator[]
                    (&race_table,(long)(int)local_1c);
          _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                     in_stack_ffffffffffffed78);
          uVar5 = local_1c;
          uVar4 = local_20;
          local_28 = (long)_Var8 + local_28;
          std::vector<race_type,_std::allocator<race_type>_>::operator[]
                    (&race_table,(long)(int)local_1c);
          _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                     in_stack_ffffffffffffed78);
          sprintf(local_1228,"(FORM) %d-%d = %ld\n\r",(ulong)uVar5,(ulong)uVar4,(long)_Var8);
          send_to_char(in_stack_ffffffffffffed90,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88));
        }
      }
    }
    fprintf(local_18," %ld;",local_28);
    local_28 = 0;
    for (local_20 = 0; (int)local_20 < 0xf; local_20 = local_20 + 1) {
      pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)(int)local_1c);
      if (pvVar7->parts[(int)local_20] != -99) {
        pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                           (&race_table,(long)(int)local_1c);
        if (pvVar7->parts[(int)local_20] < 0x1c) {
          std::vector<race_type,_std::allocator<race_type>_>::operator[]
                    (&race_table,(long)(int)local_1c);
          _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                     in_stack_ffffffffffffed78);
          uVar5 = local_1c;
          uVar4 = local_20;
          local_28 = (long)_Var8 + local_28;
          in_stack_ffffffffffffed90 = local_1228;
          std::vector<race_type,_std::allocator<race_type>_>::operator[]
                    (&race_table,(long)(int)local_1c);
          _Var8 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffed80 >> 0x20),
                                     in_stack_ffffffffffffed78);
          sprintf(in_stack_ffffffffffffed90,"(PARTS) %d-%d = %ld\n\r",(ulong)uVar5,(ulong)uVar4,
                  (long)_Var8);
          send_to_char(in_stack_ffffffffffffed90,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88));
        }
      }
    }
    fprintf(local_18," %ld;",local_28);
    in_stack_ffffffffffffed80 = local_18;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    in_stack_ffffffffffffed8c = pvVar7->arms;
    pvVar7 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)(int)local_1c);
    fprintf(in_stack_ffffffffffffed80," %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n",
            (ulong)in_stack_ffffffffffffed8c,(ulong)(uint)pvVar7->legs);
    local_1c = local_1c + 1;
  }
  fclose(local_18);
  return;
}

Assistant:

void do_racedump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(RACE_DUMP_FILE, "w");
	int race = 0, i = 0;
	long temp_bit = 0;
	char buf[MSL];

	for (race = 0; race_table[race].name != nullptr; race++)
	{
		fprintf(fp, ";%s;%s;%s;%s;", race_table[race].name, race_table[race].name, race_table[race].name, race_table[race].name);
		fprintf(fp, " %d;", race_table[race].pc_race);

		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].act[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].act[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].aff[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].aff[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].off[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].off[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].imm[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].imm[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].res[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].res[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].vuln[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].vuln[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].form[i] != NO_FLAG && race_table[race].form[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].form[i]);
				sprintf(buf, "(FORM) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].parts[i] != NO_FLAG && race_table[race].parts[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].parts[i]);
				sprintf(buf, "(PARTS) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		fprintf(fp, " %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n", race_table[race].arms, race_table[race].legs);
	}

	fclose(fp);
}